

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcie_cfg_read.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint len;
  int iVar1;
  ssize_t sVar2;
  nettlp_pcie_cfg *__buf;
  char *__s;
  uint16_t addr;
  nettlp_pcie_cfg ntpc;
  char buf [2048];
  uint16_t local_84e;
  uint local_84c;
  nettlp_pcie_cfg local_848;
  undefined1 local_838 [2056];
  
  local_84e = 0;
  memset(local_838,0,0x800);
  local_848.remote_addr.s_addr = 0;
  local_848.local_addr.s_addr = 0;
  local_848.sockfd = 0;
  local_84c = 0;
  do {
    while (iVar1 = getopt(argc,argv,"r:l:a:s:h"), 0x6b < iVar1) {
      __buf = (nettlp_pcie_cfg *)&local_848.local_addr;
      if ((iVar1 == 0x6c) || (__buf = &local_848, iVar1 == 0x72)) {
        iVar1 = inet_pton(2,_optarg,__buf);
        if (iVar1 < 1) {
          __s = "inet_pton";
LAB_001025eb:
          perror(__s);
          return -1;
        }
      }
      else {
        if (iVar1 != 0x73) goto LAB_001025a8;
        local_84c = atoi(_optarg);
        if (local_84c - 0x801 < 0xfffff800) {
          main_cold_1();
          return -1;
        }
      }
    }
    if (iVar1 != 0x61) {
      if (iVar1 != -1) {
LAB_001025a8:
        puts(
            "usage\n    -r remote addr\n    -l local addr\n    -a 0xXX (hex), target addr in PCIe configuration space\n    -s size to read"
            );
        return -1;
      }
      iVar1 = nettlp_pcie_cfg_init(&local_848);
      len = local_84c;
      if (iVar1 < 0) {
        __s = "nettlp_pcie_cfg_init";
      }
      else {
        sVar2 = nettlp_pcie_cfg_read(&local_848,local_84e,local_838,(ulong)local_84c);
        if (-1 < (int)sVar2) {
          hexdump(local_838,len);
          return 0;
        }
        __s = "nettlp_pcie_cfg_read";
      }
      goto LAB_001025eb;
    }
    iVar1 = __isoc99_sscanf(_optarg,"0x%hx",&local_84e);
    if (iVar1 < 1) {
      main_cold_2();
      return -1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
	int ret, ch;
	char buf[2048];
	int size = 0;
	uint16_t addr = 0;
	struct nettlp_pcie_cfg ntpc;

	memset(buf, 0, sizeof(buf));
	memset(&ntpc, 0, sizeof(ntpc));

	while ((ch = getopt(argc, argv, "r:l:a:s:h")) != -1) {
		switch (ch) {
		case 'r':
			ret = inet_pton(AF_INET, optarg, &ntpc.remote_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'l':
			ret = inet_pton(AF_INET, optarg, &ntpc.local_addr);
			if (ret < 1) {
				perror("inet_pton");
				return -1;
			}
			break;

		case 'a':
			ret = sscanf(optarg, "0x%hx", &addr);
			if (ret < 1) {
				fprintf(stderr, "invalid address\n");
				return -1;
			}
			break;
				
		case 's':
			size = atoi(optarg);
			if (size < 1 || size > sizeof(buf)) {
				fprintf(stderr, "invalid size\n");
				return -1;
			}
			break;

		case 'h':
		default:
			usage();
			return -1;
		}
	}

	ret = nettlp_pcie_cfg_init(&ntpc);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_init");
		return -1;
	}

	ret = nettlp_pcie_cfg_read(&ntpc, addr, buf, size);
	if (ret < 0) {
		perror("nettlp_pcie_cfg_read");
		return -1;
	}
	
	hexdump(buf, size);

	return 0;
}